

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsLoadSignalHandlerCallback(_func_HelicsBool_int *handler,HelicsBool useSeparateThread)

{
  code *pcVar1;
  code *__handler;
  
  pcVar1 = anon_unknown.dwarf_182b7::signalHandlerThreadedCallback;
  if (useSeparateThread == 0) {
    pcVar1 = anon_unknown.dwarf_182b7::signalHandlerCallback;
  }
  __handler = anon_unknown.dwarf_182b7::signalHandlerThreaded;
  if (useSeparateThread == 0) {
    __handler = anon_unknown.dwarf_182b7::signalHandler;
  }
  if (handler != (_func_HelicsBool_int *)0x0) {
    __handler = pcVar1;
  }
  (anonymous_namespace)::keyHandler = handler;
  signal(2,__handler);
  return;
}

Assistant:

void helicsLoadSignalHandlerCallback(HelicsBool (*handler)(int), HelicsBool useSeparateThread)
{
    keyHandler = handler;
    if (handler != nullptr) {
        if (useSeparateThread != HELICS_FALSE) {
            static_cast<void>(signal(SIGINT, signalHandlerThreadedCallback));
        } else {
            static_cast<void>(signal(SIGINT, signalHandlerCallback));
        }

    } else {
        if (useSeparateThread != HELICS_FALSE) {
            helicsLoadThreadedSignalHandler();
        } else {
            helicsLoadSignalHandler();
        }
    }
}